

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void prepare_vertical_filter_coeffs(int gamma,int sy,__m128i *coeffs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 *in_RDX;
  int in_ESI;
  int in_EDI;
  __m128i tmp_14;
  __m128i tmp_12;
  __m128i tmp_10;
  __m128i tmp_8;
  __m128i tmp_6;
  __m128i tmp_4;
  __m128i tmp_2;
  __m128i tmp_0;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  __m128i tmp_15;
  __m128i tmp_13;
  __m128i tmp_11;
  __m128i tmp_9;
  __m128i tmp_7;
  __m128i tmp_5;
  __m128i tmp_3;
  __m128i tmp_1;
  
  iVar1 = in_ESI + in_EDI * 2 >> 10;
  iVar2 = in_ESI + in_EDI * 4 >> 10;
  iVar3 = in_ESI + in_EDI * 6 >> 10;
  local_198 = (undefined4)*(undefined8 *)av1_warped_filter[in_ESI >> 10];
  uStack_194 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[in_ESI >> 10] >> 0x20);
  local_1a8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar1];
  uStack_1a4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar1] >> 0x20);
  local_1b8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar2];
  uStack_1b4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar2] >> 0x20);
  local_1c8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar3];
  uStack_1c4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar3] >> 0x20);
  uStack_110 = (undefined4)*(undefined8 *)(av1_warped_filter[in_ESI >> 10] + 4);
  uStack_10c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[in_ESI >> 10] + 4) >> 0x20);
  uStack_120 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar1] + 4);
  uStack_11c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar1] + 4) >> 0x20);
  uStack_130 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar2] + 4);
  uStack_12c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar2] + 4) >> 0x20);
  uStack_140 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar3] + 4);
  uStack_13c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar3] + 4) >> 0x20);
  *in_RDX = local_198;
  in_RDX[1] = local_1a8;
  in_RDX[2] = local_1b8;
  in_RDX[3] = local_1c8;
  in_RDX[4] = uStack_194;
  in_RDX[5] = uStack_1a4;
  in_RDX[6] = uStack_1b4;
  in_RDX[7] = uStack_1c4;
  in_RDX[8] = uStack_110;
  in_RDX[9] = uStack_120;
  in_RDX[10] = uStack_130;
  in_RDX[0xb] = uStack_140;
  in_RDX[0xc] = uStack_10c;
  in_RDX[0xd] = uStack_11c;
  in_RDX[0xe] = uStack_12c;
  in_RDX[0xf] = uStack_13c;
  iVar1 = in_ESI + in_EDI >> 10;
  iVar2 = in_ESI + in_EDI * 3 >> 10;
  iVar3 = in_ESI + in_EDI * 5 >> 10;
  iVar4 = in_ESI + in_EDI * 7 >> 10;
  local_1d8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar1];
  uStack_1d4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar1] >> 0x20);
  local_1e8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar2];
  uStack_1e4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar2] >> 0x20);
  local_1f8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar3];
  uStack_1f4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar3] >> 0x20);
  local_208 = (undefined4)*(undefined8 *)av1_warped_filter[iVar4];
  uStack_204 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar4] >> 0x20);
  uStack_150 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar1] + 4);
  uStack_14c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar1] + 4) >> 0x20);
  uStack_160 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar2] + 4);
  uStack_15c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar2] + 4) >> 0x20);
  uStack_170 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar3] + 4);
  uStack_16c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar3] + 4) >> 0x20);
  uStack_180 = (undefined4)*(undefined8 *)(av1_warped_filter[iVar4] + 4);
  uStack_17c = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar4] + 4) >> 0x20);
  in_RDX[0x10] = local_1d8;
  in_RDX[0x11] = local_1e8;
  in_RDX[0x12] = local_1f8;
  in_RDX[0x13] = local_208;
  in_RDX[0x14] = uStack_1d4;
  in_RDX[0x15] = uStack_1e4;
  in_RDX[0x16] = uStack_1f4;
  in_RDX[0x17] = uStack_204;
  in_RDX[0x18] = uStack_150;
  in_RDX[0x19] = uStack_160;
  in_RDX[0x1a] = uStack_170;
  in_RDX[0x1b] = uStack_180;
  in_RDX[0x1c] = uStack_14c;
  in_RDX[0x1d] = uStack_15c;
  in_RDX[0x1e] = uStack_16c;
  in_RDX[0x1f] = uStack_17c;
  return;
}

Assistant:

static inline void prepare_vertical_filter_coeffs(int gamma, int sy,
                                                  __m128i *coeffs) {
  const __m128i tmp_0 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_2 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_4 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_6 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

  const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
  const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
  const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
  const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

  // even coeffs
  coeffs[0] = _mm_unpacklo_epi64(tmp_8, tmp_10);
  coeffs[1] = _mm_unpackhi_epi64(tmp_8, tmp_10);
  coeffs[2] = _mm_unpacklo_epi64(tmp_12, tmp_14);
  coeffs[3] = _mm_unpackhi_epi64(tmp_12, tmp_14);

  const __m128i tmp_1 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_3 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_5 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_7 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

  const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
  const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
  const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
  const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

  // odd coeffs
  coeffs[4] = _mm_unpacklo_epi64(tmp_9, tmp_11);
  coeffs[5] = _mm_unpackhi_epi64(tmp_9, tmp_11);
  coeffs[6] = _mm_unpacklo_epi64(tmp_13, tmp_15);
  coeffs[7] = _mm_unpackhi_epi64(tmp_13, tmp_15);
}